

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O2

uint highbd_obmc_sad(uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int width,int height)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  lVar4 = (long)pre8 * 2;
  uVar6 = 0;
  uVar5 = (ulong)(uint)width;
  if (width < 1) {
    uVar5 = uVar6;
  }
  if (height < 1) {
    height = 0;
  }
  uVar1 = 0;
  for (; (int)uVar6 != height; uVar6 = (ulong)((int)uVar6 + 1)) {
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      iVar3 = wsrc[uVar2] - (uint)*(ushort *)(lVar4 + uVar2 * 2) * mask[uVar2];
      iVar7 = -iVar3;
      if (0 < iVar3) {
        iVar7 = iVar3;
      }
      uVar1 = uVar1 + (iVar7 + 0x800U >> 0xc);
    }
    mask = mask + (uint)width;
    lVar4 = lVar4 + (long)pre_stride * 2;
    wsrc = wsrc + (uint)width;
  }
  return uVar1;
}

Assistant:

static inline unsigned int highbd_obmc_sad(
                                const uint8_t *pre8, int pre_stride,
                                const int32_t *wsrc, const int32_t *mask,
                                int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++)
      sad += ROUND_POWER_OF_TWO(abs(wsrc[x] - pre[x] * mask[x]), 12);

    pre += pre_stride;
    wsrc += width;
    mask += width;
  }

  return sad;
}